

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ReReloop::create(ReReloop *this)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0xb8);
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  pp_Var1[0xd] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[0xe] = (_func_int *)0x0;
  pp_Var1[0xf] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)(pp_Var1 + 4);
  *pp_Var1 = (_func_int *)&PTR__ReReloop_01075808;
  pp_Var1[0x10] = (_func_int *)0x0;
  pp_Var1[0xd] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  pp_Var1[0x11] = (_func_int *)(pp_Var1 + 0xf);
  pp_Var1[0x12] = (_func_int *)(pp_Var1 + 0xf);
  pp_Var1[0x13] = (_func_int *)0x0;
  pp_Var1[0x14] = (_func_int *)0x0;
  pp_Var1[0x15] = (_func_int *)0x0;
  pp_Var1[0x16] = (_func_int *)0x0;
  (this->super_Pass)._vptr_Pass = pp_Var1;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<ReReloop>();
  }